

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

int __thiscall Sudoku::rKrok(Sudoku *this,int index)

{
  sudoku_policko sVar1;
  int iVar2;
  int iVar3;
  sudoku_policko *psVar4;
  int i;
  ulong uVar5;
  int cisla [9];
  int local_1f4 [2];
  Sudoku novy;
  
  cisla[4] = 5;
  cisla[5] = 6;
  cisla[6] = 7;
  cisla[7] = 8;
  cisla[0] = 1;
  cisla[1] = 2;
  cisla[2] = 3;
  cisla[3] = 4;
  cisla[8] = 9;
  iVar2 = jednoducheReseni(this);
  if (iVar2 == 0) {
    psVar4 = (this->s).pole + index;
    do {
      iVar2 = index;
      sVar1 = *psVar4;
      psVar4 = psVar4 + 1;
      index = iVar2 + 1;
    } while (((uint)sVar1 & 0xf) != 0);
    std::random_shuffle<int*>(cisla,local_1f4);
    for (uVar5 = 0; uVar5 != 9; uVar5 = uVar5 + 1) {
      memcpy(&novy,this,0x1bc);
      iVar3 = doplnK(&novy,iVar2 % 9,iVar2 / 9,cisla[uVar5]);
      if ((iVar3 != 0) && (iVar3 = rKrok(&novy,iVar2 + 1), iVar3 != 0)) {
        memcpy(this,&novy,0x1bc);
        return (uint)(uVar5 < 9);
      }
    }
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Sudoku::rKrok (int index)
{
  int vysledek;
  int cisla[] = {1, 2, 3, 4, 5, 6, 7, 8, 9}; // seznam cisel na vyzkouseni
  // funguje to tak, ze si udelame tento seznam a ten pak pokazde nahodne prehazime
  // pro nedostatecne specifikovane sudoku (majici vice reseni) to znamena, ze reseni jsou nahodna

  // projdeme doplnovaci metodu, pokud to jde, vratime kladny vysledek
  // tato motoda diky tomu jak je postavena odchyti nektere kriticke stavy jako pokusy o pristup mimo pridelenou pamet apod.
  if (jednoducheReseni()) // povedlo se...
  {
    return true;
  }
  // nepovedlo se :/
  // zkusime to nasilnejsi metodou... hadanim :)
  else // budeme pokracovat v rekurzi
  {
    while (s.pole[index].zapsane) index++; // hledame dalsi prazdne policko
    random_shuffle(cisla, cisla + 9);// prehazime seznam cisel k vyzkoseni - soucast <algorithm>
    for (int i = 0; i< 9;i++)// vyzkousime vsechny mozna cisla v seznamu
    {
      Sudoku novy(this); // zkopirujeme si stavajici sudoku
      
      if(novy.doplnK(index%9,index/9,cisla[i])) // zkusime cislo doplnit
      {
        // slo to
        if(novy.rKrok(index+1)) // prokud se podari doplnit i dalsi pozici, je vse OK
        {
          s = novy.s; // okopirujeme stav noveho sudoku do puvodniho (tohoto)
          return true; // vse OK
        }
      }
    }
  }
  return false; // rekurze nad neplatnym sudoku vede k chybam...
}